

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

void __thiscall
jbcoin::template_field_error::template_field_error(template_field_error *this,SField *f)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  SField::getName_abi_cxx11_(&local_30,f);
  std::operator+(&local_70,"template field error \'",&local_30);
  std::operator+(&local_50,&local_70,"\'");
  std::logic_error::logic_error(&this->super_logic_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__logic_error_002f72a0;
  return;
}

Assistant:

explicit
    template_field_error (SField const& f)
        : logic_error(
            "template field error '" + f.getName() + "'")
    {
    }